

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAcademicGeoMesh.cpp
# Opt level: O0

TPZGeoMesh * __thiscall TPZAcademicGeoMesh::PyramidalAndTetrahedralMesh(TPZAcademicGeoMesh *this)

{
  TPZGeoMesh *this_00;
  long *plVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long in_RDI;
  int il_1;
  int64_t index;
  int il;
  TPZManVector<long,_5> elnodes;
  int el;
  TPZManVector<long,_8> nodes;
  int64_t k;
  int64_t j;
  int64_t i;
  int dim;
  TPZGeoMesh *gmesh;
  int MaterialId;
  int64_t nelem;
  TPZGeoMesh *in_stack_000002a8;
  TPZAcademicGeoMesh *in_stack_000002b0;
  int64_t in_stack_fffffffffffffe18;
  TPZManVector<long,_8> *in_stack_fffffffffffffe20;
  _func_int **in_stack_fffffffffffffe38;
  TPZManVector<long,_5> *in_stack_fffffffffffffe40;
  long *in_stack_fffffffffffffe48;
  TPZGeoMesh *in_stack_fffffffffffffe50;
  TPZGeoMesh *in_stack_fffffffffffffec8;
  TPZAcademicGeoMesh *in_stack_fffffffffffffed0;
  int local_114;
  undefined1 local_110 [12];
  int local_104;
  undefined1 local_100 [8];
  TPZGeoMesh *in_stack_ffffffffffffff08;
  TPZAcademicGeoMesh *in_stack_ffffffffffffff10;
  int local_b4;
  TPZVec<long> local_a8 [3];
  long local_48;
  long local_40;
  long local_38;
  undefined4 local_30;
  TPZGeoMesh *local_20;
  uint local_14;
  long local_10;
  
  local_10 = *(long *)(in_RDI + 0x2f0);
  local_14 = *(uint *)(in_RDI + 0x2f8);
  this_00 = (TPZGeoMesh *)operator_new(0x2a8);
  TPZGeoMesh::TPZGeoMesh(in_stack_fffffffffffffe50);
  local_30 = 3;
  local_20 = this_00;
  TPZGeoMesh::SetDimension(this_00,3);
  GenerateNodes(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  for (local_38 = 0; local_38 < local_10; local_38 = local_38 + 1) {
    for (local_40 = 0; local_40 < local_10; local_40 = local_40 + 1) {
      for (local_48 = 0; local_48 < local_10; local_48 = local_48 + 1) {
        TPZManVector<long,_8>::TPZManVector
                  ((TPZManVector<long,_8> *)in_stack_fffffffffffffe50,
                   (int64_t)in_stack_fffffffffffffe48,(long *)in_stack_fffffffffffffe40);
        lVar4 = local_10 + 1;
        lVar4 = local_48 * lVar4 * lVar4 + local_40 * lVar4 + local_38;
        plVar1 = TPZVec<long>::operator[](local_a8,0);
        *plVar1 = lVar4;
        lVar5 = local_10 + 1;
        lVar3 = local_48 * lVar5;
        lVar2 = local_40 * lVar5;
        lVar4 = local_38 + 1;
        plVar1 = TPZVec<long>::operator[](local_a8,1);
        *plVar1 = lVar4 + lVar3 * lVar5 + lVar2;
        lVar5 = local_10 + 1;
        lVar3 = local_48 * lVar5;
        lVar2 = local_40 + 1;
        lVar4 = local_38 + 1;
        plVar1 = TPZVec<long>::operator[](local_a8,2);
        *plVar1 = lVar4 + lVar3 * lVar5 + lVar2 * lVar5;
        lVar4 = local_10 + 1;
        lVar4 = local_48 * lVar4 * lVar4 + (local_40 + 1) * lVar4 + local_38;
        plVar1 = TPZVec<long>::operator[](local_a8,3);
        *plVar1 = lVar4;
        lVar4 = local_10 + 1;
        lVar4 = (local_48 + 1) * lVar4 * lVar4 + local_40 * lVar4 + local_38;
        plVar1 = TPZVec<long>::operator[](local_a8,4);
        *plVar1 = lVar4;
        lVar3 = local_48 + 1;
        lVar5 = local_10 + 1;
        lVar2 = local_40 * lVar5;
        lVar4 = local_38 + 1;
        plVar1 = TPZVec<long>::operator[](local_a8,5);
        *plVar1 = lVar4 + lVar3 * lVar5 * lVar5 + lVar2;
        lVar3 = local_48 + 1;
        lVar5 = local_10 + 1;
        lVar2 = local_40 + 1;
        lVar4 = local_38 + 1;
        plVar1 = TPZVec<long>::operator[](local_a8,6);
        *plVar1 = lVar4 + lVar3 * lVar5 * lVar5 + lVar2 * lVar5;
        lVar4 = local_10 + 1;
        in_stack_fffffffffffffe50 =
             (TPZGeoMesh *)((local_48 + 1) * lVar4 * lVar4 + (local_40 + 1) * lVar4 + local_38);
        plVar1 = TPZVec<long>::operator[](local_a8,7);
        *plVar1 = (long)in_stack_fffffffffffffe50;
        for (local_b4 = 0; local_b4 < 2; local_b4 = local_b4 + 1) {
          TPZManVector<long,_5>::TPZManVector
                    (in_stack_fffffffffffffe40,(int64_t)in_stack_fffffffffffffe38);
          for (local_104 = 0; local_104 < 5; local_104 = local_104 + 1) {
            in_stack_fffffffffffffe48 =
                 TPZVec<long>::operator[](local_a8,(long)pyramid[local_b4][local_104]);
            in_stack_fffffffffffffe38 = (_func_int **)*in_stack_fffffffffffffe48;
            in_stack_fffffffffffffe40 =
                 (TPZManVector<long,_5> *)
                 TPZVec<long>::operator[]((TPZVec<long> *)local_100,(long)local_104);
            (in_stack_fffffffffffffe40->super_TPZVec<long>)._vptr_TPZVec = in_stack_fffffffffffffe38
            ;
          }
          (*(local_20->super_TPZSavable)._vptr_TPZSavable[0xc])
                    (local_20,5,local_100,(ulong)local_14,local_110,1);
          TPZVec<long>::resize
                    (&in_stack_fffffffffffffe20->super_TPZVec<long>,in_stack_fffffffffffffe18);
          for (local_114 = 0; local_114 < 4; local_114 = local_114 + 1) {
            plVar1 = TPZVec<long>::operator[](local_a8,(long)tetraedra[local_b4][local_114]);
            in_stack_fffffffffffffe20 = (TPZManVector<long,_8> *)*plVar1;
            plVar1 = TPZVec<long>::operator[]((TPZVec<long> *)local_100,(long)local_114);
            *plVar1 = (long)in_stack_fffffffffffffe20;
          }
          (*(local_20->super_TPZSavable)._vptr_TPZSavable[0xc])
                    (local_20,4,local_100,(ulong)local_14,local_110,1);
          TPZManVector<long,_5>::~TPZManVector((TPZManVector<long,_5> *)in_stack_fffffffffffffe20);
        }
        TPZManVector<long,_8>::~TPZManVector(in_stack_fffffffffffffe20);
      }
    }
  }
  TPZGeoMesh::BuildConnectivity((TPZGeoMesh *)nodes.super_TPZVec<long>._vptr_TPZVec);
  AddBoundaryElementsByCoord(in_stack_000002b0,in_stack_000002a8);
  if ((*(byte *)(in_RDI + 0x2e8) & 1) != 0) {
    DeformGMesh(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  }
  return local_20;
}

Assistant:

TPZGeoMesh *TPZAcademicGeoMesh::PyramidalAndTetrahedralMesh()
{
    int64_t nelem = fNumberElements;
    int MaterialId = fMaterialId;
    TPZGeoMesh *gmesh = new TPZGeoMesh;
    const int dim = 3;
    gmesh->SetDimension(dim);
    GenerateNodes(gmesh);
  
    for (int64_t i=0; i<nelem; i++) {
        for (int64_t j=0; j<nelem; j++) {
            for (int64_t k=0; k<nelem; k++) {
                TPZManVector<int64_t,8> nodes(8,0);
                nodes[0] = k*(nelem+1)*(nelem+1)+j*(nelem+1)+i;
                nodes[1] = k*(nelem+1)*(nelem+1)+j*(nelem+1)+i+1;
                nodes[2] = k*(nelem+1)*(nelem+1)+(j+1)*(nelem+1)+i+1;
                nodes[3] = k*(nelem+1)*(nelem+1)+(j+1)*(nelem+1)+i;
                nodes[4] = (k+1)*(nelem+1)*(nelem+1)+j*(nelem+1)+i;
                nodes[5] = (k+1)*(nelem+1)*(nelem+1)+j*(nelem+1)+i+1;
                nodes[6] = (k+1)*(nelem+1)*(nelem+1)+(j+1)*(nelem+1)+i+1;
                nodes[7] = (k+1)*(nelem+1)*(nelem+1)+(j+1)*(nelem+1)+i;
#ifdef PZ_LOG
                if(logger.isDebugEnabled())
                {
                    std::stringstream sout;
                    sout << "Pyramid and tetrahedral nodes " << nodes;
                    LOGPZ_DEBUG(logger, sout.str())
                }
#endif
                for (int el=0; el<2; el++)
                {
                    TPZManVector<int64_t,5> elnodes(5);
                    for (int il=0; il<5; il++) {
                        elnodes[il] = nodes[pyramid[el][il]];
                    }
                    int64_t index;
                    gmesh->CreateGeoElement(EPiramide, elnodes, MaterialId, index);
                    elnodes.resize(4);
                    for (int il=0; il<4; il++) {
                        elnodes[il] = nodes[tetraedra[el][il]];
                    }
                    gmesh->CreateGeoElement(ETetraedro, elnodes, MaterialId, index);
                }
            }
        }
    }
    gmesh->BuildConnectivity();
//    AddBoundaryElements(gmesh);
    AddBoundaryElementsByCoord(gmesh);
    if (fShouldDeform) {
        DeformGMesh(*gmesh);
    }
    return gmesh;
}